

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::DiskSourceTree::DiskSourceTree(DiskSourceTree *this)

{
  DiskSourceTree *this_local;
  
  SourceTree::SourceTree(&this->super_SourceTree);
  (this->super_SourceTree)._vptr_SourceTree = (_func_int **)&PTR__DiskSourceTree_006f8ca8;
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::vector(&this->mappings_);
  std::__cxx11::string::string((string *)&this->last_error_message_);
  return;
}

Assistant:

DiskSourceTree::DiskSourceTree() {}